

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall JSON::Parser::unexpected(Parser *this,int current)

{
  int __val;
  Position PVar1;
  ostream *this_00;
  __cxx11 local_1d0 [32];
  __cxx11 local_1b0 [32];
  __cxx11 local_190 [32];
  string local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [8];
  string msg;
  int local_6c;
  int iStack_68;
  Position position;
  JSON local_58 [8];
  string str;
  string local_38 [8];
  string source;
  int current_local;
  Parser *this_local;
  
  checkEndOfUnexpected(this,current);
  std::__cxx11::string::string(local_38,(string *)&this->input);
  getStringAt(local_58,(string *)local_38,this->pos);
  PVar1 = getPosition((string *)local_38,current);
  std::operator+((char *)local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Uncaught SyntaxError: Unexpected token ");
  std::operator+(local_150,(char *)local_170);
  __val = getStringIndexAt((string *)local_38,current);
  std::__cxx11::to_string(local_190,__val);
  std::operator+(local_130,local_150);
  std::operator+(local_110,(char *)local_130);
  local_6c = PVar1.line;
  std::__cxx11::to_string(local_1b0,local_6c);
  std::operator+(local_f0,local_110);
  std::operator+(local_d0,(char *)local_f0);
  iStack_68 = PVar1.column;
  std::__cxx11::to_string(local_1d0,iStack_68);
  std::operator+(local_b0,local_d0);
  std::operator+(local_90,(char *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string(local_170);
  this_00 = std::operator<<((ostream *)&std::cerr,(string *)local_90);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void Parser::unexpected(int current) {
        checkEndOfUnexpected(current);

        string source = input;
        string str = getStringAt(source, pos);
        Position position = getPosition(source, current);
        string msg = "Uncaught SyntaxError: Unexpected token "
                     + str + " in JSON at position " + to_string(getStringIndexAt(source, current))
                     + " (line " + to_string(position.line) + ", column " + to_string(position.column) + ")";
        cerr << msg << endl;
        exit(1);
    }